

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffomem(fitsfile **fptr,char *name,int mode,void **buffptr,size_t *buffsize,size_t deltasize,
          _func_void_ptr_void_ptr_size_t *mem_realloc,int *status)

{
  fitsfile **ppfVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  FITSfile *pFVar5;
  size_t sVar6;
  char *pcVar7;
  LONGLONG *pLVar8;
  char *pcVar9;
  int handle;
  int extvers;
  int movetotype;
  fitsfile **local_1de8;
  int local_1de0;
  int extnum;
  int hdutyp;
  int driver;
  fitsfile *local_1dd0;
  char *local_1dc8;
  LONGLONG filesize;
  char extname [71];
  char urltype [20];
  char errmsg [81];
  char imagecolname [71];
  char extspec [1025];
  char rowexpress [1025];
  char colspec [1025];
  char binspec [1025];
  char rowfilter [1025];
  char outfile [1025];
  char infile [1025];
  
  if (0 < *status) {
    return *status;
  }
  *fptr = (fitsfile *)0x0;
  if (need_to_initialize != 0) {
    local_1de8 = (fitsfile **)buffptr;
    iVar2 = fits_init_cfitsio();
    *status = iVar2;
    buffptr = local_1de8;
    if (0 < iVar2) {
      return iVar2;
    }
  }
  pcVar9 = name + -1;
  do {
    pcVar7 = pcVar9 + 1;
    pcVar9 = pcVar9 + 1;
  } while (*pcVar7 == ' ');
  local_1de8 = fptr;
  local_1de0 = mode;
  ffiurl(pcVar9,urltype,infile,outfile,extspec,rowfilter,binspec,colspec,status);
  builtin_strncpy(urltype,"memkeep://",0xb);
  iVar2 = urltype2driver(urltype,&driver);
  *status = iVar2;
  if (iVar2 == 0) {
    iVar2 = mem_openmem(buffptr,buffsize,deltasize,mem_realloc,&handle);
    ppfVar1 = local_1de8;
    *status = iVar2;
    if (iVar2 < 1) {
      lVar4 = (long)driver;
      iVar2 = (*driverTable[lVar4].size)(handle,&filesize);
      *status = iVar2;
      if (0 < iVar2) {
        (*driverTable[lVar4].close)(handle);
        ffpmsg("failed get the size of the memory file: (ffomem)");
        return *status;
      }
      local_1dd0 = (fitsfile *)calloc(1,0x10);
      *ppfVar1 = local_1dd0;
      if (local_1dd0 == (fitsfile *)0x0) {
        (*driverTable[lVar4].close)(handle);
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(pcVar9);
      }
      else {
        pFVar5 = (FITSfile *)calloc(1,0x7e8);
        local_1dd0->Fptr = pFVar5;
        if (pFVar5 == (FITSfile *)0x0) {
          (*driverTable[lVar4].close)(handle);
          ffpmsg("failed to allocate structure for following file: (ffomem)");
          ffpmsg(pcVar9);
        }
        else {
          sVar6 = strlen(pcVar9);
          uVar3 = (int)sVar6 + 1;
          sVar6 = 0x20;
          if (0x20 < (int)uVar3) {
            sVar6 = (size_t)uVar3;
          }
          pcVar7 = (char *)malloc(sVar6);
          pFVar5->filename = pcVar7;
          if (pcVar7 == (char *)0x0) {
            (*driverTable[lVar4].close)(handle);
            ffpmsg("failed to allocate memory for filename: (ffomem)");
            ffpmsg(pcVar9);
          }
          else {
            local_1dc8 = pcVar7;
            pLVar8 = (LONGLONG *)calloc(0x3e9,8);
            pFVar5->headstart = pLVar8;
            if (pLVar8 == (LONGLONG *)0x0) {
              (*driverTable[lVar4].close)(handle);
              ffpmsg("failed to allocate memory for headstart array: (ffomem)");
              ffpmsg(pcVar9);
            }
            else {
              pcVar7 = (char *)calloc(0x28,0xb40);
              pFVar5->iobuffer = pcVar7;
              if (pcVar7 != (char *)0x0) {
                for (lVar4 = 0x1d2; lVar4 != 0x1fa; lVar4 = lVar4 + 1) {
                  (&pFVar5->filehandle)[lVar4] = (int)lVar4 + -0x1d2;
                  *(undefined8 *)((long)pFVar5 + lVar4 * 8 + -0x928) = 0xffffffffffffffff;
                }
                pFVar5->MAXHDU = 1000;
                pFVar5->filehandle = handle;
                pFVar5->driver = driver;
                strcpy(local_1dc8,pcVar9);
                pFVar5->filesize = filesize;
                pFVar5->logfilesize = filesize;
                pFVar5->writemode = local_1de0;
                pFVar5->datastart = -1;
                pFVar5->curbuf = -1;
                pFVar5->open_count = 1;
                pFVar5->validcode = 0x22b;
                pFVar5->noextsyntax = 0;
                ffldrc(local_1dd0,0,0,status);
                fits_store_Fptr((*ppfVar1)->Fptr,status);
                iVar2 = ffrhdu(*ppfVar1,&hdutyp,status);
                if (0 < iVar2) {
                  ffpmsg("ffomem could not interpret primary array header of file: (ffomem)");
                  ffpmsg(pcVar9);
                  if (*status == 0xfc) {
                    ffpmsg("This does not look like a FITS file.");
                  }
                  ffclos(*ppfVar1,status);
                  *ppfVar1 = (fitsfile *)0x0;
                }
                imagecolname[0] = '\0';
                rowexpress[0] = '\0';
                if (extspec[0] != '\0') {
                  ffexts(extspec,&extnum,extname,&extvers,&movetotype,imagecolname,rowexpress,status
                        );
                  if (0 < *status) {
                    return *status;
                  }
                  if (extnum == 0) {
                    if (extname[0] != '\0') {
                      ffmnhd(*ppfVar1,movetotype,extname,extvers,status);
                    }
                  }
                  else {
                    ffmahd(*ppfVar1,extnum + 1,&hdutyp,status);
                  }
                  if (*status < 1) {
                    return *status;
                  }
                  ffpmsg("ffomem could not move to the specified extension:");
                  if (extnum < 1) {
                    snprintf(errmsg,0x51," extension with EXTNAME = %s,",extname);
                    ffpmsg(errmsg);
                    if (extvers != 0) {
                      snprintf(errmsg,0x51,"           and with EXTVERS = %d,");
                      ffpmsg(errmsg);
                    }
                    pcVar9 = " doesn\'t exist or couldn\'t be opened.";
                    if ((long)movetotype != -1) {
                      snprintf(errmsg,0x51,"           and with XTENSION = %s,",
                               *(undefined8 *)(&DAT_001f1b60 + (long)movetotype * 8));
                      ffpmsg(errmsg);
                    }
                  }
                  else {
                    pcVar9 = errmsg;
                    snprintf(pcVar9,0x51,
                             " extension number %d doesn\'t exist or couldn\'t be opened.",
                             (ulong)(uint)extnum);
                  }
                  ffpmsg(pcVar9);
                  return *status;
                }
                goto LAB_00106f21;
              }
              (*driverTable[lVar4].close)(handle);
              ffpmsg("failed to allocate memory for iobuffer array: (ffomem)");
              ffpmsg(pcVar9);
              free((*ppfVar1)->Fptr->headstart);
            }
            free((*ppfVar1)->Fptr->filename);
          }
          free((*ppfVar1)->Fptr);
        }
        free(*ppfVar1);
        *ppfVar1 = (fitsfile *)0x0;
      }
      *status = 0x71;
      return 0x71;
    }
    pcVar9 = "failed to open pre-existing memory file: (ffomem)";
  }
  else {
    pcVar9 = "could not find driver for pre-existing memory file: (ffomem)";
  }
  ffpmsg(pcVar9);
LAB_00106f21:
  return *status;
}

Assistant:

int ffomem(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           const char *name,     /* I - name of file to open                */
           int mode,             /* I - 0 = open readonly; 1 = read/write   */
           void **buffptr,       /* I - address of memory pointer           */
           size_t *buffsize,     /* I - size of buffer, in bytes            */
           size_t deltasize,     /* I - increment for future realloc's      */
           void *(*mem_realloc)(void *p, size_t newsize), /* function       */
           int *status)          /* IO - error status                       */
/*
  Open an existing FITS file in core memory.  This is a specialized version
  of ffopen.
*/
{
    int ii, driver, handle, hdutyp, slen, movetotype, extvers, extnum;
    char extname[FLEN_VALUE];
    LONGLONG filesize;
    char urltype[MAX_PREFIX_LEN], infile[FLEN_FILENAME], outfile[FLEN_FILENAME];
    char extspec[FLEN_FILENAME], rowfilter[FLEN_FILENAME];
    char binspec[FLEN_FILENAME], colspec[FLEN_FILENAME];
    char imagecolname[FLEN_VALUE], rowexpress[FLEN_FILENAME];
    char *url, errmsg[FLEN_ERRMSG];
    char *hdtype[3] = {"IMAGE", "TABLE", "BINTABLE"};

    if (*status > 0)
        return(*status);

    *fptr = 0;                   /* initialize null file pointer */

    if (need_to_initialize)           /* this is called only once */
    {
        *status = fits_init_cfitsio();

        if (*status > 0)
            return(*status);
    }

    url = (char *) name;
    while (*url == ' ')  /* ignore leading spaces in the file spec */
        url++;

        /* parse the input file specification */
    fits_parse_input_url(url, urltype, infile, outfile, extspec,
              rowfilter, binspec, colspec, status);

    strcpy(urltype, "memkeep://");   /* URL type for pre-existing memory file */

    *status = urltype2driver(urltype, &driver);

    if (*status > 0)
    {
        ffpmsg("could not find driver for pre-existing memory file: (ffomem)");
        return(*status);
    }

    /* call driver routine to open the memory file */
    FFLOCK;  /* lock this while searching for vacant handle */
    *status =   mem_openmem( buffptr, buffsize,deltasize,
                            mem_realloc,  &handle);
    FFUNLOCK;

    if (*status > 0)
    {
         ffpmsg("failed to open pre-existing memory file: (ffomem)");
         return(*status);
    }

        /* get initial file size */
    *status = (*driverTable[driver].size)(handle, &filesize);

    if (*status > 0)
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed get the size of the memory file: (ffomem)");
        return(*status);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(url);
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(url);
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = strlen(url) + 1;
    slen = maxvalue(slen, 32); /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffomem)");
        ffpmsg(url);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffomem)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffomem)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* file handle */
    ((*fptr)->Fptr)->driver = driver;            /* driver number */
    strcpy(((*fptr)->Fptr)->filename, url);      /* full input filename */
    ((*fptr)->Fptr)->filesize = filesize;        /* physical file size */
    ((*fptr)->Fptr)->logfilesize = filesize;     /* logical file size */
    ((*fptr)->Fptr)->writemode = mode;      /* read-write mode    */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED; /* unknown start of data */
    ((*fptr)->Fptr)->curbuf = -1;             /* undefined current IO buffer */
    ((*fptr)->Fptr)->open_count = 1;     /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = 0;  /* extended syntax can be used in filename */

    ffldrc(*fptr, 0, REPORT_EOF, status);     /* load first record */

    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */

    if (ffrhdu(*fptr, &hdutyp, status) > 0)  /* determine HDU structure */
    {
        ffpmsg(
          "ffomem could not interpret primary array header of file: (ffomem)");
        ffpmsg(url);

        if (*status == UNKNOWN_REC)
           ffpmsg("This does not look like a FITS file.");

        ffclos(*fptr, status);
        *fptr = 0;              /* return null file pointer */
    }

    /* ---------------------------------------------------------- */
    /* move to desired extension, if specified as part of the URL */
    /* ---------------------------------------------------------- */

    imagecolname[0] = '\0';
    rowexpress[0] = '\0';

    if (*extspec)
    {
       /* parse the extension specifier into individual parameters */
       ffexts(extspec, &extnum, 
         extname, &extvers, &movetotype, imagecolname, rowexpress, status);


      if (*status > 0)
          return(*status);

      if (extnum)
      {
        ffmahd(*fptr, extnum + 1, &hdutyp, status);
      }
      else if (*extname) /* move to named extension, if specified */
      {
        ffmnhd(*fptr, movetotype, extname, extvers, status);
      }

      if (*status > 0)
      {
        ffpmsg("ffomem could not move to the specified extension:");
        if (extnum > 0)
        {
          snprintf(errmsg, FLEN_ERRMSG,
          " extension number %d doesn't exist or couldn't be opened.",extnum);
          ffpmsg(errmsg);
        }
        else
        {
          snprintf(errmsg, FLEN_ERRMSG,
          " extension with EXTNAME = %s,", extname);
          ffpmsg(errmsg);

          if (extvers)
          {
             snprintf(errmsg, FLEN_ERRMSG,
             "           and with EXTVERS = %d,", extvers);
             ffpmsg(errmsg);
          }

          if (movetotype != ANY_HDU)
          {
             snprintf(errmsg, FLEN_ERRMSG,
             "           and with XTENSION = %s,", hdtype[movetotype]);
             ffpmsg(errmsg);
          }

          ffpmsg(" doesn't exist or couldn't be opened.");
        }
        return(*status);
      }
    }

    return(*status);
}